

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

void __thiscall soplex::SPxDevexPR<double>::entered4(SPxDevexPR<double> *this,SPxId param_1,int n)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  pointer pdVar4;
  UpdateVector<double> *pUVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  if ((n < 0) ||
     (pSVar2 = (this->super_SPxPricer<double>).thesolver, (pSVar2->thecovectors->set).thenum <= n))
  {
    return;
  }
  pUVar3 = pSVar2->thePvec;
  pdVar4 = (pUVar3->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pUVar5 = pSVar2->theCoPvec;
  pdVar6 = (pUVar5->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar9 = 1.0 / (pSVar2->theFvec->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[(uint)n];
  dVar9 = dVar9 * dVar9 * this->last;
  uVar8 = (ulong)(uint)(pUVar5->thedelta).super_IdxSet.num;
  while (0 < (int)uVar8) {
    iVar1 = (pUVar5->thedelta).super_IdxSet.idx[uVar8 - 1];
    dVar10 = pdVar6[iVar1];
    pdVar7 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = dVar9 * dVar10 * dVar10 + pdVar7[iVar1];
    pdVar7[iVar1] = dVar10;
    if ((dVar10 <= 1.0) || (uVar8 = uVar8 - 1, 1000000.0 < dVar10)) goto LAB_0020b053;
  }
  uVar8 = (ulong)(uint)(pUVar3->thedelta).super_IdxSet.num;
  do {
    if ((int)uVar8 < 1) {
      return;
    }
    iVar1 = (pUVar3->thedelta).super_IdxSet.idx[uVar8 - 1];
    dVar10 = pdVar4[iVar1];
    pdVar6 = (pSVar2->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = dVar9 * dVar10 * dVar10 + pdVar6[iVar1];
    pdVar6[iVar1] = dVar10;
  } while ((1.0 < dVar10) && (uVar8 = uVar8 - 1, dVar10 <= 1000000.0));
LAB_0020b053:
  setupWeights(this,ENTER);
  return;
}

Assistant:

void SPxDevexPR<R>::entered4(SPxId /*id*/, int n)
{
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(n >= 0 && n < this->thesolver->dim())
   {
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      xi_p = xi_p * xi_p * last;

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         coWeights[i] += xi_p * coPvec[i] * coPvec[i];

         if(coWeights[i] <= 1 || coWeights[i] > 1e+6)
         {
            setupWeights(SPxSolverBase<R>::ENTER);
            return;
         }
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         weights[i] += xi_p * pVec[i] * pVec[i];

         if(weights[i] <= 1 || weights[i] > 1e+6)
         {
            setupWeights(SPxSolverBase<R>::ENTER);
            return;
         }
      }
   }
}